

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O2

double mpe(double *predicted,double *actual,int N)

{
  double dVar1;
  double *err;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  
  err = (double *)malloc((long)N * 8);
  pe(predicted,actual,N,err);
  uVar2 = 0;
  uVar4 = (ulong)(uint)N;
  if (N < 1) {
    uVar4 = uVar2;
  }
  dVar5 = 0.0;
  iVar3 = 0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    dVar1 = err[uVar2];
    if (!NAN(dVar1)) {
      dVar5 = dVar5 + dVar1;
    }
    iVar3 = iVar3 + (uint)!NAN(dVar1);
  }
  free(err);
  return dVar5 / (double)iVar3;
}

Assistant:

double mpe(double *predicted, double *actual, int N) {
    double err,temp;
    double *errvec;
    int i,j;

    errvec = (double*) malloc(sizeof(double)*N);

    pe(predicted,actual,N,errvec);
    j = 0;
    temp = 0.0;
    for(i = 0; i < N;++i) {
        if (errvec[i] == errvec[i]) {
            j++;
            temp += errvec[i];
        }
    }

    err = temp/j;

    free(errvec);
    return err;
}